

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm_Async.cpp
# Opt level: O0

void adios2::core::engine::BP5Writer::AsyncWriteThread_TwoLevelShm_SendDataToAggregator
               (MPIShmChain *a,BufferV *Data)

{
  char *pcVar1;
  size_t sVar2;
  size_type sVar3;
  ShmDataBuffer *pSVar4;
  reference pvVar5;
  long *in_RSI;
  size_t n;
  ShmDataBuffer *b;
  size_t temp_offset;
  size_t block;
  size_t nBlocks;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  MPIShmChain *this;
  MPIShmChain *in_stack_ffffffffffffffa0;
  long local_40;
  ulong local_38;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_28;
  
  (**(code **)(*in_RSI + 0x10))(&local_28);
  sVar3 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::size(&local_28);
  local_38 = 0;
  local_40 = 0;
  while (local_38 < sVar3) {
    pSVar4 = aggregator::MPIShmChain::LockProducerBuffer(in_stack_ffffffffffffffa0);
    pSVar4->actual_size = 0;
    do {
      pvVar5 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (&local_28,local_38);
      in_stack_ffffffffffffffa0 = (MPIShmChain *)(pvVar5->iov_len - local_40);
      if ((MPIShmChain *)(pSVar4->max_size - pSVar4->actual_size) < in_stack_ffffffffffffffa0) {
        in_stack_ffffffffffffffa0 = (MPIShmChain *)(pSVar4->max_size - pSVar4->actual_size);
      }
      pcVar1 = pSVar4->buf;
      sVar2 = pSVar4->actual_size;
      pvVar5 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (&local_28,local_38);
      memcpy(pcVar1 + sVar2,(void *)((long)pvVar5->iov_base + local_40),
             (size_t)in_stack_ffffffffffffffa0);
      pSVar4->actual_size =
           (long)&(in_stack_ffffffffffffffa0->super_MPIAggregator)._vptr_MPIAggregator +
           pSVar4->actual_size;
      this = (MPIShmChain *)
             ((long)&(in_stack_ffffffffffffffa0->super_MPIAggregator)._vptr_MPIAggregator + local_40
             );
      pvVar5 = std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::operator[]
                         (&local_28,local_38);
      if (this < (MPIShmChain *)pvVar5->iov_len) {
        local_40 = (long)&(in_stack_ffffffffffffffa0->super_MPIAggregator)._vptr_MPIAggregator +
                   local_40;
      }
      else {
        local_40 = 0;
        local_38 = local_38 + 1;
      }
    } while ((pSVar4->actual_size < pSVar4->max_size) && (local_38 < sVar3));
    aggregator::MPIShmChain::UnlockProducerBuffer(this);
  }
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)
             in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void BP5Writer::AsyncWriteThread_TwoLevelShm_SendDataToAggregator(aggregator::MPIShmChain *a,
                                                                  format::BufferV *Data)
{
    /* In a loop, copy the local data into the shared memory, alternating
       between the two segments.
    */

    std::vector<core::iovec> DataVec = Data->DataVec();
    size_t nBlocks = DataVec.size();

    // size_t sent = 0;
    size_t block = 0;
    size_t temp_offset = 0;
    while (block < nBlocks)
    {
        // potentially blocking call waiting on Aggregator
        aggregator::MPIShmChain::ShmDataBuffer *b = a->LockProducerBuffer();
        // b->max_size: how much we can copy
        // b->actual_size: how much we actually copy
        b->actual_size = 0;
        while (true)
        {
            /* Copy n bytes from the current block, current offset to shm
                making sure to use up to shm_size bytes
            */
            size_t n = DataVec[block].iov_len - temp_offset;
            if (n > (b->max_size - b->actual_size))
            {
                n = b->max_size - b->actual_size;
            }
            std::memcpy(&b->buf[b->actual_size],
                        (const char *)DataVec[block].iov_base + temp_offset, n);
            b->actual_size += n;

            /* Have we processed the entire block or staying with it? */
            if (n + temp_offset < DataVec[block].iov_len)
            {
                temp_offset += n;
            }
            else
            {
                temp_offset = 0;
                ++block;
            }

            /* Have we reached the max allowed shm size ?*/
            if (b->actual_size >= b->max_size)
            {
                break;
            }
            if (block >= nBlocks)
            {
                break;
            }
        }
        // sent += b->actual_size;
        a->UnlockProducerBuffer();
    }
}